

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O1

QString * QIBusPlatformInputContextPrivate::getSocketPath(void)

{
  char16_t *pcVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  storage_type *psVar6;
  qsizetype qVar7;
  Data *pDVar8;
  QArrayData *pQVar9;
  void *pvVar10;
  QTypedArrayData<char16_t> *__old_val_3;
  char16_t *__old_val_4;
  longlong __old_val_2;
  longlong __old_val_5;
  char *pcVar11;
  QString *in_RDI;
  char16_t *__old_val_1;
  QTypedArrayData<char16_t> *__old_val;
  uint uVar12;
  char *b;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QArrayData *local_228;
  char16_t *pcStack_220;
  qsizetype local_218;
  QArrayData *local_210;
  char16_t *local_208;
  qsizetype qStack_200;
  QArrayData *local_1f8;
  char *local_1f0;
  qsizetype local_1e8;
  QArrayData *local_1e0;
  char16_t *pcStack_1d8;
  qsizetype local_1d0;
  QByteArray local_1c8;
  QByteArray local_1a8;
  QByteArray local_188;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
  local_170;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
  local_118;
  char16_t local_c0;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
  local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_188.d.d = (Data *)0x0;
  local_188.d.ptr = (char *)0x0;
  local_188.d.size = 0;
  local_1a8.d.size = -0x5555555555555556;
  local_1a8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1a8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_1a8,"0",-1);
  (in_RDI->d).size = -0x5555555555555556;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  qEnvironmentVariable((char *)in_RDI);
  pcVar1 = (in_RDI->d).ptr;
  if (pcVar1 == (char16_t *)0x0) {
    qgetenv((char *)&local_b8);
    pQVar9 = (QArrayData *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
    pcVar11 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr);
    local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_188.d.d,0);
    local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_188.d.d >> 0x20);
    uVar5 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
    local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_188.d.ptr;
    local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_188.d.ptr >> 0x20);
    local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_188.d.size;
    local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_188.d.size >> 0x20);
    local_188.d.ptr = pcVar11;
    local_188.d.size = uVar5;
    if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,1,0x10);
        local_188.d.d = (Data *)pQVar9;
        pQVar9 = &(local_188.d.d)->super_QArrayData;
      }
    }
    local_188.d.d = (Data *)pQVar9;
    bVar3 = local_188.d.size != 0U;
    pQVar9 = &(local_188.d.d)->super_QArrayData;
    if (local_188.d.size == 0U) {
      qgetenv((char *)&local_b8);
      pDVar8 = local_188.d.d;
      pQVar9 = (QArrayData *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_)
      ;
      pcVar11 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr);
      local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_188.d.d,0);
      local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_188.d.d >> 0x20);
      uVar5 = CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
      local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_188.d.ptr;
      local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_188.d.ptr >> 0x20);
      local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_188.d.size;
      local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_188.d.size >> 0x20);
      local_188.d.ptr = pcVar11;
      local_188.d.size = uVar5;
      if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          local_188.d.d = (Data *)pQVar9;
          QArrayData::deallocate(&pDVar8->super_QArrayData,1,0x10);
          pQVar9 = &(local_188.d.d)->super_QArrayData;
        }
      }
    }
  }
  else {
    bVar3 = false;
    pQVar9 = &(local_188.d.d)->super_QArrayData;
  }
  local_188.d.d = (Data *)pQVar9;
  if (pcVar1 == (char16_t *)0x0) {
    pDVar2 = (in_RDI->d).d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((in_RDI->d).d)->super_QArrayData,2,0x10);
      }
    }
    local_1c8.d.size = -0x5555555555555556;
    local_1c8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1c8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_1c8,"unix",-1);
    qVar7 = local_188.d.size;
    pcVar11 = local_188.d.ptr;
    if (bVar3) {
      QByteArray::operator=(&local_1a8,&local_188);
      pQVar9 = &(local_1a8.d.d)->super_QArrayData;
    }
    else {
      iVar4 = (int)local_188.d.ptr;
      if ((local_188.d.size == 0) ||
         (pvVar10 = memchr(local_188.d.ptr,0x3a,local_188.d.size), pvVar10 == (void *)0x0)) {
        uVar12 = 0xffffffff;
      }
      else {
        uVar12 = (int)pvVar10 - iVar4;
      }
      pQVar9 = &(local_1c8.d.d)->super_QArrayData;
      if (0 < (int)uVar12) {
        if ((ulong)(uVar12 & 0x7fffffff) < (ulong)qVar7) {
          QByteArray::QByteArray((QByteArray *)&local_b8,pcVar11,(ulong)(uVar12 & 0x7fffffff));
        }
        else {
          local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_188.d.d,0);
          local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_188.d.d >> 0x20);
          local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar11 >> 0x20);
          local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)qVar7;
          local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)qVar7 >> 0x20);
          local_b8.a.a.a.a.a.a.d.ptr._0_4_ = iVar4;
          if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
            ;
            UNLOCK();
          }
        }
        pDVar8 = local_1c8.d.d;
        pQVar9 = (QArrayData *)
                 CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_);
        pcVar11 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr)
        ;
        local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_1c8.d.d,0);
        local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_1c8.d.d >> 0x20);
        psVar6 = (storage_type *)
                 CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size)
        ;
        local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_1c8.d.ptr;
        local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_1c8.d.ptr >> 0x20);
        local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_1c8.d.size;
        local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_1c8.d.size >> 0x20);
        local_1c8.d.ptr = pcVar11;
        local_1c8.d.size = (qsizetype)psVar6;
        if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            local_1c8.d.d = (Data *)pQVar9;
            QArrayData::deallocate(&pDVar8->super_QArrayData,1,0x10);
            pQVar9 = &(local_1c8.d.d)->super_QArrayData;
          }
        }
      }
      local_1c8.d.d = (Data *)pQVar9;
      local_b8.a.a.a.a.a.a.d.d._0_4_ = (undefined4)local_188.d.size;
      local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_188.d.size >> 0x20);
      local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_188.d.ptr;
      local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_188.d.ptr >> 0x20);
      QByteArrayView::indexOf((QByteArrayView *)&local_b8,'.',(long)(int)(uVar12 + 1));
      QByteArray::mid((longlong)&local_b8,(longlong)&local_188);
      pDVar8 = local_1a8.d.d;
      pQVar9 = (QArrayData *)CONCAT44(local_b8.a.a.a.a.a.a.d.d._4_4_,local_b8.a.a.a.a.a.a.d.d._0_4_)
      ;
      pcVar11 = (char *)CONCAT44(local_b8.a.a.a.a.a.a.d.ptr._4_4_,(int)local_b8.a.a.a.a.a.a.d.ptr);
      local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(local_1a8.d.d,0);
      local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)local_1a8.d.d >> 0x20);
      psVar6 = (storage_type *)
               CONCAT44(local_b8.a.a.a.a.a.a.d.size._4_4_,(undefined4)local_b8.a.a.a.a.a.a.d.size);
      local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)local_1a8.d.ptr;
      local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)local_1a8.d.ptr >> 0x20);
      local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)local_1a8.d.size;
      local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)local_1a8.d.size >> 0x20);
      local_1a8.d.ptr = pcVar11;
      local_1a8.d.size = (qsizetype)psVar6;
      if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          local_1a8.d.d = (Data *)pQVar9;
          QArrayData::deallocate(&pDVar8->super_QArrayData,1,0x10);
          pQVar9 = &(local_1a8.d.d)->super_QArrayData;
        }
      }
    }
    local_1a8.d.d = (Data *)pQVar9;
    lcQpaInputMethods();
    if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) !=
        0) {
      local_b8.a.a.a.a.a.a.d.d._0_4_ = 2;
      local_b8.a.a.a.a.a.a.d.d._4_4_ = 0;
      local_b8.a.a.a.a.a.a.d.ptr._0_4_ = 0;
      local_b8.a.a.a.a.a.a.d.ptr._4_4_ = 0;
      local_b8.a.a.a.a.a.a.d.size._0_4_ = 0;
      local_b8.a.a.a.a.a.a.d.size._4_4_ = 0;
      local_b8.a.a.a.a.a.b.m_size = (qsizetype)lcQpaInputMethods::category.name;
      QMessageLogger::debug();
      pDVar2 = local_170.a.a.a.a.d.d;
      QVar13.m_data = (storage_type *)0x5;
      QVar13.m_size = (qsizetype)&local_118;
      QString::fromUtf8(QVar13);
      QTextStream::operator<<((QTextStream *)pDVar2,(QString *)&local_118);
      if (&(local_118.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_118.a.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
      }
      pcVar11 = local_1c8.d.ptr;
      if (local_1c8.d.ptr == (char *)0x0) {
        pcVar11 = (char *)&QByteArray::_empty;
      }
      QDebug::putByteArray((char *)&local_170,(ulong)pcVar11,(Latin1Content)local_1c8.d.size);
      if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
      }
      pDVar2 = local_170.a.a.a.a.d.d;
      QVar14.m_data = (storage_type *)0xd;
      QVar14.m_size = (qsizetype)&local_118;
      QString::fromUtf8(QVar14);
      QTextStream::operator<<((QTextStream *)pDVar2,(QString *)&local_118);
      if (&(local_118.a.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_118.a.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_118.a.a.a.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
      }
      pcVar11 = local_1a8.d.ptr;
      if (local_1a8.d.ptr == (char *)0x0) {
        pcVar11 = (char *)&QByteArray::_empty;
      }
      QDebug::putByteArray((char *)&local_170,(ulong)pcVar11,(Latin1Content)local_1a8.d.size);
      if (*(QTextStream *)((long)local_170.a.a.a.a.d.d + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_170.a.a.a.a.d.d,' ');
      }
      QDebug::~QDebug((QDebug *)&local_170);
    }
    QStandardPaths::writableLocation((StandardLocation)&local_1e0);
    qVar7 = local_1d0;
    pcVar1 = pcStack_1d8;
    pQVar9 = local_1e0;
    local_1e0 = (QArrayData *)0x0;
    pcStack_1d8 = (char16_t *)0x0;
    local_1d0 = 0;
    QDBusConnection::localMachineId();
    QVar15.m_data = (storage_type *)local_1c8.d.size;
    QVar15.m_size = (qsizetype)&local_210;
    QString::fromLocal8Bit(QVar15);
    local_118.b.d.size = qStack_200;
    local_118.b.d.ptr = local_208;
    local_118.b.d.d = (Data *)local_210;
    local_170.a.a.a.b.m_size = 10;
    local_170.a.a.a.b.m_data = "/ibus/bus/";
    local_170.a.a.b.m_size = local_1e8;
    local_170.a.a.b.m_data = local_1f0;
    local_170.a.b = L'-';
    local_210 = (QArrayData *)0x0;
    local_208 = (char16_t *)0x0;
    qStack_200 = 0;
    local_170.a.a.a.a.d.d = (Data *)0x0;
    local_118.a.a.a.a.d.d = (Data *)pQVar9;
    local_170.a.a.a.a.d.ptr = (char16_t *)0x0;
    local_118.a.a.a.a.d.ptr = pcVar1;
    local_170.a.a.a.a.d.size = 0;
    local_118.a.a.a.a.d.size = qVar7;
    local_118.a.a.a.b.m_size = 10;
    local_118.a.a.a.b.m_data = "/ibus/bus/";
    local_118.a.a.b.m_size = local_1e8;
    local_118.a.a.b.m_data = local_1f0;
    local_118.a.b = L'-';
    local_170.b.d.d = (Data *)0x0;
    local_170.b.d.ptr = (char16_t *)0x0;
    local_170.b.d.size = 0;
    local_c0 = L'-';
    QVar16.m_data = (storage_type *)local_1a8.d.size;
    QVar16.m_size = (qsizetype)&local_228;
    QString::fromLocal8Bit(QVar16);
    local_b8.a.a.b.d.size = local_118.b.d.size;
    local_b8.a.a.b.d.ptr = local_118.b.d.ptr;
    local_b8.a.a.b.d.d = local_118.b.d.d;
    qVar7 = local_118.a.a.a.a.d.size;
    pcVar1 = local_118.a.a.a.a.d.ptr;
    pDVar2 = local_118.a.a.a.a.d.d;
    local_b8.b.d.size = local_218;
    local_b8.b.d.ptr = pcStack_220;
    local_b8.b.d.d = (Data *)local_228;
    local_118.a.a.a.a.d.d = (Data *)0x0;
    local_118.a.a.a.a.d.ptr = (char16_t *)0x0;
    local_b8.a.a.a.a.a.a.d.d._0_4_ = SUB84(pDVar2,0);
    local_b8.a.a.a.a.a.a.d.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
    local_b8.a.a.a.a.a.a.d.ptr._0_4_ = (int)pcVar1;
    local_b8.a.a.a.a.a.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
    local_118.a.a.a.a.d.size = 0;
    local_b8.a.a.a.a.a.a.d.size._0_4_ = (undefined4)qVar7;
    local_b8.a.a.a.a.a.a.d.size._4_4_ = (undefined4)((ulong)qVar7 >> 0x20);
    local_b8.a.a.a.a.a.b.m_size = local_118.a.a.a.b.m_size;
    local_b8.a.a.a.a.a.b.m_data = local_118.a.a.a.b.m_data;
    local_b8.a.a.a.a.b.m_size = local_118.a.a.b.m_size;
    local_b8.a.a.a.a.b.m_data = local_118.a.a.b.m_data;
    local_b8.a.a.a.b = local_118.a.b;
    local_118.b.d.d = (Data *)0x0;
    local_118.b.d.ptr = (char16_t *)0x0;
    local_118.b.d.size = 0;
    local_b8.a.b = local_c0;
    local_228 = (QArrayData *)0x0;
    pcStack_220 = (char16_t *)0x0;
    local_218 = 0;
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
    ::convertTo<QString>(in_RDI,&local_b8);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>,_char16_t>,_QString>
    ::~QStringBuilder(&local_b8);
    if (local_228 != (QArrayData *)0x0) {
      LOCK();
      (local_228->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_228->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_228->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_228,2,0x10);
      }
    }
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
    ::~QStringBuilder(&local_118);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_QLatin1String>,_QLatin1String>,_char16_t>,_QString>
    ::~QStringBuilder(&local_170);
    if (local_210 != (QArrayData *)0x0) {
      LOCK();
      (local_210->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_210->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_210->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_210,2,0x10);
      }
    }
    if (local_1f8 != (QArrayData *)0x0) {
      LOCK();
      (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1f8,1,0x10);
      }
    }
    if (local_1e0 != (QArrayData *)0x0) {
      LOCK();
      (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_1e0,2,0x10);
      }
    }
    if (&(local_1c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_1c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_1c8.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (&(local_1a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_188.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_188.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_188.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QIBusPlatformInputContextPrivate::getSocketPath()
{
    QByteArray display;
    QByteArray displayNumber = "0";
    bool isWayland = false;

    if (QString path = qEnvironmentVariable("IBUS_ADDRESS_FILE"); !path.isNull()) {
        return path;
    } else if (display = qgetenv("WAYLAND_DISPLAY"); !display.isEmpty()) {
        isWayland = true;
    } else {
        display = qgetenv("DISPLAY");
    }
    QByteArray host = "unix";

    if (isWayland) {
        displayNumber = display;
    } else {
        int pos = display.indexOf(':');
        if (pos > 0)
            host = display.left(pos);
        ++pos;
        int pos2 = display.indexOf('.', pos);
        if (pos2 > 0)
            displayNumber = display.mid(pos, pos2 - pos);
         else
            displayNumber = display.mid(pos);
    }

    qCDebug(lcQpaInputMethods) << "host=" << host << "displayNumber" << displayNumber;

    return QStandardPaths::writableLocation(QStandardPaths::ConfigLocation) +
               "/ibus/bus/"_L1 +
               QLatin1StringView(QDBusConnection::localMachineId()) +
               u'-' + QString::fromLocal8Bit(host) + u'-' + QString::fromLocal8Bit(displayNumber);
}